

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

void recv_loop_cleanup(void *p)

{
  long lVar1;
  long in_FS_OFFSET;
  ulong local_28;
  size_t i;
  recv_loop_cleanup_args *args;
  void *p_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (p != (void *)0x0) {
    if (**p != 0) {
      lrtr_free((void *)**p);
      **p = 0;
    }
    if (**(long **)((long)p + 8) != 0) {
      lrtr_free((void *)**(undefined8 **)((long)p + 8));
      **(undefined8 **)((long)p + 8) = 0;
    }
    if (**(long **)((long)p + 0x10) != 0) {
      lrtr_free((void *)**(undefined8 **)((long)p + 0x10));
      **(undefined8 **)((long)p + 0x10) = 0;
    }
    if (**(long **)((long)p + 0x18) != 0) {
      for (local_28 = 0; local_28 < **(ulong **)((long)p + 0x20); local_28 = local_28 + 1) {
        if (*(long *)(**(long **)((long)p + 0x18) + local_28 * 8) != 0) {
          lrtr_free(*(void **)(**(long **)((long)p + 0x18) + local_28 * 8));
        }
      }
      lrtr_free((void *)**(undefined8 **)((long)p + 0x18));
      **(undefined8 **)((long)p + 0x18) = 0;
      **(undefined8 **)((long)p + 0x20) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void recv_loop_cleanup(void *p)
{
	struct recv_loop_cleanup_args *args = p;

	if (!args)
		return;

	if (*args->ipv4_pdus) {
		lrtr_free(*args->ipv4_pdus);
		*args->ipv4_pdus = NULL;
	}

	if (*args->ipv6_pdus) {
		lrtr_free(*args->ipv6_pdus);
		*args->ipv6_pdus = NULL;
	}

	if (*args->router_key_pdus) {
		lrtr_free(*args->router_key_pdus);
		*args->router_key_pdus = NULL;
	}

	if (*args->aspa_pdus) {
		for (size_t i = 0; i < *args->aspa_pdu_count; i++) {
			if ((*args->aspa_pdus)[i])
				lrtr_free((*args->aspa_pdus)[i]);
		}

		lrtr_free(*args->aspa_pdus);
		*args->aspa_pdus = NULL;
		*args->aspa_pdu_count = 0;
	}
}